

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

OrphanBuilder *
capnp::_::OrphanBuilder::initData
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ByteCount size)

{
  uint uVar1;
  AllocateResult AVar2;
  ThrowOverflow local_21;
  
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  __return_storage_ptr__->location = (word *)0x0;
  (__return_storage_ptr__->tag).content = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  uVar1 = assertMaxBits<29u,unsigned_int,kj::ThrowOverflow>(size,&local_21);
  AVar2 = BuilderArena::allocate(arena,uVar1 + 7 >> 3);
  *(undefined4 *)&(__return_storage_ptr__->tag).content = 0xfffffffd;
  *(uint *)((long)&(__return_storage_ptr__->tag).content + 4) = uVar1 * 8 + 2;
  __return_storage_ptr__->segment = AVar2.segment;
  __return_storage_ptr__->capTable = capTable;
  __return_storage_ptr__->location = AVar2.words;
  return __return_storage_ptr__;
}

Assistant:

OrphanBuilder OrphanBuilder::initData(
    BuilderArena* arena, CapTableBuilder* capTable, ByteCount size) {
  OrphanBuilder result;
  auto allocation = WireHelpers::initDataPointer(result.tagAsPtr(), nullptr, capTable,
      assertMaxBits<BLOB_SIZE_BITS>(size), arena);
  result.segment = allocation.segment;
  result.capTable = capTable;
  result.location = reinterpret_cast<word*>(allocation.value.begin());
  return result;
}